

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

protocol_find_ret handle_word(cio_websocket_location_handler *handler,char *str,size_t len)

{
  _Bool _Var1;
  char *str_00;
  size_t len_00;
  char *start;
  size_t len_local;
  char *str_local;
  cio_websocket_location_handler *handler_local;
  
  str_00 = strip_leading_whitespace(str,len);
  if (str_00 == (char *)0x0) {
    handler_local._4_4_ = WS_PROTOCOL_ERROR;
  }
  else {
    len_00 = strip_trailing_whitespace(str_00,len - ((long)str_00 - (long)str));
    _Var1 = has_illegal_characters(str_00,len_00);
    if (_Var1) {
      handler_local._4_4_ = WS_PROTOCOL_ERROR;
    }
    else {
      _Var1 = find_requested_sub_protocol(handler,str_00,len_00);
      if (_Var1) {
        handler_local._4_4_ = WS_PROTOCOL_FOUND;
      }
      else {
        handler_local._4_4_ = WS_PROTOCOL_NOT_FOUND;
      }
    }
  }
  return handler_local._4_4_;
}

Assistant:

static enum protocol_find_ret handle_word(struct cio_websocket_location_handler *handler, const char *str, size_t len)
{
	const char *start = strip_leading_whitespace(str, len);
	if (cio_unlikely(start == NULL)) {
		return WS_PROTOCOL_ERROR;
	}

	len -= (size_t)(ptrdiff_t)(start - str);
	len = strip_trailing_whitespace(start, len);

	if (cio_unlikely(has_illegal_characters(start, len))) {
		return WS_PROTOCOL_ERROR;
	}

	if (find_requested_sub_protocol(handler, start, len)) {
		return WS_PROTOCOL_FOUND;
	}

	return WS_PROTOCOL_NOT_FOUND;
}